

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectoringNozzleSystem.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::VectoringNozzleSystem::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,VectoringNozzleSystem *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Vectoring Nozzle System:",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"\n\tHorizontal Deflection Angle: ",0x1f);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32HDeflAngle);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\n\tVertical Deflection Angle:   ",0x1f);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32VDeflAngle);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString VectoringNozzleSystem::GetAsString() const
{
    KStringStream ss;

    ss << "Vectoring Nozzle System:"
       << "\n\tHorizontal Deflection Angle: " << m_f32HDeflAngle
       << "\n\tVertical Deflection Angle:   " << m_f32VDeflAngle
       << "\n";

    return ss.str();
}